

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_duplicate_set.c
# Opt level: O3

oonf_duplicate_result
oonf_duplicate_test(oonf_duplicate_set *set,uint8_t msg_type,netaddr *originator,uint64_t seqno)

{
  oonf_log_source source;
  oonf_duplicate_result oVar1;
  avl_node *paVar2;
  char *pcVar3;
  oonf_duplicate_entry_key key;
  netaddr_str nbuf;
  
  key.addr._addr._0_8_ = *(undefined8 *)originator->_addr;
  key.addr._addr._8_8_ = *(undefined8 *)(originator->_addr + 8);
  key.addr._type = originator->_type;
  key.addr._prefix_len = originator->_prefix_len;
  key.msg_type = msg_type;
  paVar2 = avl_find(&set->_tree,&key);
  if (paVar2 == (avl_node *)0x0) {
    oVar1 = OONF_DUPSET_FIRST;
  }
  else {
    oVar1 = _test(set,(oonf_duplicate_entry *)(paVar2 + -1),seqno,false);
  }
  source = _oonf_duplicate_set_subsystem.logging;
  if ((log_global_mask[_oonf_duplicate_set_subsystem.logging] & 1) != 0) {
    pcVar3 = netaddr_to_prefixstring(&nbuf,originator,false);
    oonf_log(LOG_SEVERITY_DEBUG,source,"src/base/oonf_duplicate_set.c",0x10a,(void *)0x0,0,
             "Test msgtype %u, originator %s, seqno %lu: %s",(ulong)msg_type,pcVar3,seqno,
             OONF_DUPSET_RESULT_STR[oVar1]);
  }
  return oVar1;
}

Assistant:

enum oonf_duplicate_result
oonf_duplicate_test(struct oonf_duplicate_set *set, uint8_t msg_type, struct netaddr *originator, uint64_t seqno)
{
  struct oonf_duplicate_entry *entry;
  struct oonf_duplicate_entry_key key;
  enum oonf_duplicate_result result;

#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  /* generate combined key */
  memcpy(&key.addr, originator, sizeof(*originator));
  key.msg_type = msg_type;

  entry = avl_find_element(&set->_tree, &key, entry, _node);
  if (!entry) {
    result = OONF_DUPSET_FIRST;
  }
  else {
    result = _test(set, entry, seqno, false);
  }

  OONF_DEBUG(LOG_DUPLICATE_SET, "Test msgtype %u, originator %s, seqno %" PRIu64 ": %s", msg_type,
    netaddr_to_string(&nbuf, originator), seqno, OONF_DUPSET_RESULT_STR[result]);

  return result;
}